

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

_Bool roaring_iterate(roaring_bitmap_t *r,roaring_iterator iterator,void *ptr)

{
  ushort uVar1;
  uint8_t uVar2;
  _Bool _Var3;
  long lVar4;
  int *piVar5;
  uint32_t uVar6;
  ulong uVar7;
  roaring_array_t *ra;
  uint uVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  bool bVar12;
  
  if (0 < (r->high_low_container).size) {
    lVar4 = 0;
    do {
      piVar5 = (int *)(r->high_low_container).containers[lVar4];
      uVar2 = (r->high_low_container).typecodes[lVar4];
      if (uVar2 == '\x04') {
        uVar2 = (uint8_t)piVar5[2];
        piVar5 = *(int **)piVar5;
      }
      uVar1 = (r->high_low_container).keys[lVar4];
      uVar8 = (uint)uVar1 << 0x10;
      if (uVar2 == '\x03') {
        if (0 < *piVar5) {
          lVar10 = 0;
          do {
            uVar6 = CONCAT22(uVar1,*(undefined2 *)(*(long *)(piVar5 + 2) + lVar10 * 4));
            iVar9 = *(ushort *)(*(long *)(piVar5 + 2) + 2 + lVar10 * 4) + 1;
            do {
              _Var3 = (*iterator)(uVar6,ptr);
              if (!_Var3) {
                return false;
              }
              uVar6 = uVar6 + 1;
              iVar9 = iVar9 + -1;
            } while (iVar9 != 0);
            lVar10 = lVar10 + 1;
          } while (lVar10 < *piVar5);
        }
      }
      else if (uVar2 == '\x02') {
        if (0 < *piVar5) {
          lVar10 = 0;
          do {
            _Var3 = (*iterator)(CONCAT22(uVar1,*(undefined2 *)(*(long *)(piVar5 + 2) + lVar10 * 2)),
                                ptr);
            if (!_Var3) {
              return false;
            }
            lVar10 = lVar10 + 1;
          } while (lVar10 < *piVar5);
        }
      }
      else {
        uVar7 = 0;
        bVar12 = false;
        do {
          uVar11 = *(ulong *)(*(long *)(piVar5 + 2) + uVar7 * 8);
          while (uVar11 != 0) {
            lVar10 = 0;
            if (uVar11 != 0) {
              for (; (uVar11 >> lVar10 & 1) == 0; lVar10 = lVar10 + 1) {
              }
            }
            _Var3 = (*iterator)((uint)lVar10 | uVar8,ptr);
            uVar11 = uVar11 & uVar11 - 1;
            if (!_Var3) {
              if (!bVar12) {
                return false;
              }
              goto LAB_0012060e;
            }
          }
          uVar8 = uVar8 + 0x40;
          bVar12 = 0x3fe < uVar7;
          uVar7 = uVar7 + 1;
        } while (uVar7 != 0x400);
      }
LAB_0012060e:
      lVar4 = lVar4 + 1;
    } while (lVar4 < (r->high_low_container).size);
  }
  return true;
}

Assistant:

bool roaring_iterate(const roaring_bitmap_t *r, roaring_iterator iterator,
                     void *ptr) {
    const roaring_array_t *ra = &r->high_low_container;

    for (int i = 0; i < ra->size; ++i)
        if (!container_iterate(ra->containers[i], ra->typecodes[i],
                               ((uint32_t)ra->keys[i]) << 16, iterator, ptr)) {
            return false;
        }
    return true;
}